

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_utils.cc
# Opt level: O3

bool draco::parser::ParseUnsignedInt(DecoderBuffer *buffer,uint32_t *value)

{
  byte bVar1;
  uint32_t uVar2;
  long lVar3;
  byte bVar4;
  
  lVar3 = buffer->pos_ + 1;
  uVar2 = 0;
  if (lVar3 <= buffer->data_size_) {
    bVar4 = buffer->data_[buffer->pos_];
    bVar1 = bVar4 - 0x30;
    if (bVar1 < 10) {
      uVar2 = 0;
      do {
        uVar2 = ((uint)bVar4 + uVar2 * 10) - 0x30;
        buffer->pos_ = lVar3;
        if (buffer->data_size_ < lVar3 + 1) goto LAB_0011335f;
        bVar4 = buffer->data_[lVar3];
        lVar3 = lVar3 + 1;
      } while ((byte)(bVar4 - 0x30) < 10);
    }
    if (bVar1 < 10) {
LAB_0011335f:
      *value = uVar2;
      uVar2 = 1;
    }
    else {
      uVar2 = 0;
    }
  }
  return SUB41(uVar2,0);
}

Assistant:

bool ParseUnsignedInt(DecoderBuffer *buffer, uint32_t *value) {
  // Parse the number until we run out of digits.
  uint32_t v = 0;
  char ch;
  bool have_digits = false;
  while (buffer->Peek(&ch) && ch >= '0' && ch <= '9') {
    v *= 10;
    v += (ch - '0');
    buffer->Advance(1);
    have_digits = true;
  }
  if (!have_digits) {
    return false;
  }
  *value = v;
  return true;
}